

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

bool __thiscall
ON_DimStyle::Internal_SetDoubleMember
          (ON_DimStyle *this,field field_id,double value,double *class_member)

{
  bool bVar1;
  undefined1 local_29;
  bool bValueChanged;
  double *class_member_local;
  double value_local;
  field field_id_local;
  ON_DimStyle *this_local;
  
  local_29 = false;
  bVar1 = ON_IsValid(value);
  if (bVar1) {
    if ((value != *class_member) || (NAN(value) || NAN(*class_member))) {
      *class_member = value;
      Internal_ContentChange(this);
      local_29 = true;
    }
    Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  }
  return local_29;
}

Assistant:

bool ON_DimStyle::Internal_SetDoubleMember(
  ON_DimStyle::field field_id,
  double value,
  double& class_member
)
{
  bool bValueChanged = false;
  if (ON_IsValid(value))
  {
    // !(value == class_member) is used instead of (value != class_member)
    // so that when class_member = NaN, its value can be changed.
    if ( !(value == class_member) )
    {
      class_member = value;
      Internal_ContentChange();
      bValueChanged = true;
    }
    Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  }
  return bValueChanged;
}